

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  short sVar3;
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  ImGuiWindow *pIVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  ImU32 id;
  uint flags_00;
  int iVar10;
  int iVar11;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar12;
  size_t sVar13;
  undefined8 extraout_RAX;
  char *pcVar14;
  ImGuiCol idx;
  uint uVar15;
  bool is_contents_visible;
  float fVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar17;
  bool text_clipped;
  bool just_closed;
  ImGuiContext *local_c0;
  ImGuiWindow *local_b8;
  ImVec2 local_b0;
  ImGuiTabItem *local_a8;
  uint local_9c;
  ImDrawList *local_98;
  bool held;
  float local_8c;
  undefined1 local_88 [4];
  undefined1 auStack_84 [12];
  bool *local_78;
  char *local_70;
  bool hovered;
  float fStack_64;
  int local_60;
  int local_5c;
  ImRect bb;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar5 = GImGui;
  local_b8 = GImGui->CurrentWindow;
  if (local_b8->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label);
  if (p_open != (bool *)0x0) {
    if (*p_open == false) {
      bb.Min.x = 0.0;
      bb.Min.y = 0.0;
      bb.Max.x = 0.0;
      bb.Max.y = 0.0;
      ItemAdd(&bb,id,(ImRect *)0x0,0x18);
      return false;
    }
    if (((uint)flags >> 0x15 & 1) != 0) {
      __assert_fail("!p_open || !(flags & ImGuiTabItemFlags_Button)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                    ,0x1ef8,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)")
      ;
    }
  }
  if ((~flags & 0xc0U) == 0) {
    __assert_fail("(flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                  ,0x1ef9,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  local_78 = (bool *)0x0;
  flags_00 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_78 = p_open;
    flags_00 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    flags_00 = flags;
  }
  IVar17 = TabItemCalcSize(label,local_78 != (bool *)0x0);
  unique0x10000173 = extraout_XMM0_Dc;
  local_88 = (undefined1  [4])IVar17.x;
  auStack_84._0_4_ = IVar17.y;
  unique0x10000177 = extraout_XMM0_Dd;
  pIVar12 = TabBarFindTabByID(tab_bar,id);
  local_98 = (ImDrawList *)pIVar12;
  local_70 = label;
  if (pIVar12 == (ImGuiTabItem *)0x0) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = -NAN;
    bb.Max.y = -NAN;
    ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)&bb);
    pIVar12 = ImVector<ImGuiTabItem>::back(&tab_bar->Tabs);
    pIVar12->ID = id;
    pIVar12->Width = (float)local_88;
    tab_bar->TabsAddedNew = true;
  }
  iVar10 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar12);
  pcVar7 = local_70;
  tab_bar->LastTabItemIdx = (ImS16)iVar10;
  pIVar12->ContentWidth = (float)local_88;
  sVar3 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar3 + 1;
  pIVar12->BeginOrder = sVar3;
  local_9c = tab_bar->Flags;
  local_b0.x = (float)(tab_bar->PrevFrameVisible + 1);
  local_c0 = pIVar5;
  local_60 = pIVar5->FrameCount;
  local_5c = pIVar12->LastFrameVisible + 1;
  pIVar12->LastFrameVisible = local_60;
  pIVar12->Flags = flags_00;
  iVar10 = (tab_bar->TabsNames).Buf.Size;
  iVar11 = iVar10 + -1;
  if (iVar10 == 0) {
    iVar11 = 0;
  }
  pIVar12->NameOffset = iVar11;
  local_a8 = pIVar12;
  sVar13 = strlen(local_70);
  ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar7,pcVar7 + sVar13 + 1);
  if (((local_5c < local_60) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if ((int)local_b0.x < local_60) {
      if ((flags_00 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) goto LAB_00174b8d;
    }
    else if ((flags_00 >> 0x15 & 1) == 0) {
LAB_00174b8d:
      tab_bar->NextSelectedTabId = id;
    }
  }
  if ((((flags_00 & 2) != 0) && (tab_bar->SelectedTabId != id)) && ((flags_00 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    is_contents_visible = true;
  }
  else if ((tab_bar->SelectedTabId == 0 && (int)local_b0.x < local_60) &&
          ((tab_bar->Tabs).Size == 1)) {
    is_contents_visible = (tab_bar->Flags & 2) == 0;
  }
  else {
    is_contents_visible = false;
  }
  if ((local_5c < local_60) && (local_98 == (ImDrawList *)0x0 || local_60 <= (int)local_b0.x)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,0x18);
    return (bool)((flags_00 >> 0x15 & 1) == 0 & is_contents_visible);
  }
  if (tab_bar->SelectedTabId == id) {
    local_a8->LastFrameSelected = local_c0->FrameCount;
  }
  uVar15 = local_a8->Flags;
  fVar2 = local_a8->Width;
  fVar16 = local_a8->Offset;
  if ((uVar15 & 0xc0) == 0) {
    fVar16 = (float)(int)(fVar16 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar16 + (tab_bar->BarRect).Min.x;
  local_b0 = (local_b8->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar17.y = bb.Min.y;
  IVar17.x = bb.Min.x;
  (local_b8->DC).CursorPos = IVar17;
  bb.Max.x = fVar2 + bb.Min.x;
  bb.Max.y = (float)auStack_84._0_4_ + bb.Min.y;
  if ((uVar15 & 0xc0) == 0) {
    fVar2 = tab_bar->ScrollingRectMinX;
    if ((fVar2 <= bb.Min.x) && (bb.Max.x <= tab_bar->ScrollingRectMaxX)) goto LAB_00174cd5;
    fStack_64 = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar2 <= bb.Min.x) & (uint)fVar2 |
                      (uint)bb.Min.x & -(uint)(fVar2 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_8c = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    local_88 = (undefined1  [4])(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
LAB_00174cd5:
    auVar4._12_4_ = 0;
    auVar4._0_12_ = auStack_84;
    _local_88 = auVar4 << 0x20;
  }
  pIVar6 = local_b8;
  pIVar5 = local_c0;
  _hovered = bb.Max.x - bb.Min.x;
  fStack_64 = bb.Max.y - bb.Min.y;
  IVar17 = (local_b8->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(local_c0->Style).FramePadding.y);
  (pIVar6->DC).CursorMaxPos = IVar17;
  bVar8 = ItemAdd(&bb,id,(ImRect *)0x0,0);
  if (!bVar8) {
    if (local_88[0] != '\0') {
      PopClipRect();
    }
    (local_b8->DC).CursorPos = local_b0;
    return is_contents_visible;
  }
  uVar15 = flags_00 & 0x200000;
  bVar8 = ButtonBehavior(&bb,id,&hovered,&held,
                         (uVar15 >> 0x11) + (uint)pIVar5->DragDropActive * 0x200 + 0x1010);
  pIVar12 = local_a8;
  if ((bVar8) && (uVar15 == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (local_c0->ActiveId != id) {
    SetItemAllowOverlap();
  }
  if (((((held == true) && (local_60 <= local_5c)) && (bVar9 = IsMouseDragging(0,-1.0), bVar9)) &&
      ((local_c0->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) &&
     (((fVar2 = (local_c0->IO).MouseDelta.x, fVar2 < 0.0 &&
       (pIVar1 = &(local_c0->IO).MousePos, pIVar1->x <= bb.Min.x && bb.Min.x != pIVar1->x)) ||
      ((0.0 < fVar2 && (bb.Max.x < (local_c0->IO).MousePos.x)))))) {
    TabBarQueueReorderFromMousePos(tab_bar,pIVar12,(local_c0->IO).MousePos);
  }
  pcVar7 = local_70;
  local_98 = local_b8->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (is_contents_visible == false) {
      idx = (uint)((local_9c >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_9c >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(local_98,&bb,flags_00,col);
  RenderNavHighlight(&bb,id,1);
  bVar9 = IsItemHovered(0x20);
  if (bVar9) {
    bVar9 = IsMouseClicked(1,false);
    if (bVar9) {
      uVar15 = flags_00 >> 0x15 & 1;
    }
    else {
      bVar9 = IsMouseReleased(1);
      if (!bVar9) goto LAB_00174f75;
    }
    if (uVar15 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_00174f75:
  uVar15 = tab_bar->Flags;
  if (local_78 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  TabItemLabelAndCloseButton
            (local_98,&bb,uVar15 >> 1 & 4 | flags_00,tab_bar->FramePadding,pcVar7,id,close_button_id
             ,is_contents_visible,&just_closed,&text_clipped);
  if ((local_78 != (bool *)0x0) && (just_closed != false)) {
    *local_78 = false;
    TabBarCloseTab(tab_bar,local_a8);
  }
  if (local_88[0] != '\0') {
    PopClipRect();
  }
  (local_b8->DC).CursorPos = local_b0;
  if ((((text_clipped == true) && (local_c0->HoveredId == id)) && (held == false)) &&
     (((local_c0->TooltipSlowDelay <= local_c0->HoveredIdNotActiveTimer &&
        local_c0->HoveredIdNotActiveTimer != local_c0->TooltipSlowDelay &&
       (bVar9 = IsItemHovered(0), bVar9)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((local_a8->Flags & 0x10) == 0)))))) {
    pcVar14 = FindRenderedTextEnd(pcVar7,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar14 - (int)pcVar7),pcVar7);
  }
  if (((flags_00 >> 0x15 & 1) != 0) &&
     (is_contents_visible = bVar8, tab_bar->SelectedTabId == local_a8->ID)) {
    __assert_fail("!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                  ,0x1fae,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  return is_contents_visible;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    if (p_open && !*p_open)
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip
    // (Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer-> seems ok)
    // (We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar, which g.HoveredId ignores)
    // FIXME: This is a mess.
    // FIXME: We may want disabled tab to still display the tooltip?
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}